

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgSphere.cpp
# Opt level: O1

void __thiscall dgSphere::dgSphere(dgSphere *this,dgMatrix *matrix,dgVector *dim)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  float fVar19;
  undefined1 auVar20 [16];
  
  fVar1 = (matrix->m_front).super_dgTemplateVector<float>.m_y;
  fVar2 = (matrix->m_front).super_dgTemplateVector<float>.m_z;
  fVar17 = (matrix->m_front).super_dgTemplateVector<float>.m_w;
  fVar19 = (matrix->m_up).super_dgTemplateVector<float>.m_x;
  fVar16 = (matrix->m_up).super_dgTemplateVector<float>.m_y;
  fVar6 = (matrix->m_up).super_dgTemplateVector<float>.m_z;
  fVar7 = (matrix->m_up).super_dgTemplateVector<float>.m_w;
  fVar8 = (matrix->m_right).super_dgTemplateVector<float>.m_x;
  fVar9 = (matrix->m_right).super_dgTemplateVector<float>.m_y;
  fVar10 = (matrix->m_right).super_dgTemplateVector<float>.m_z;
  fVar11 = (matrix->m_right).super_dgTemplateVector<float>.m_w;
  fVar12 = (matrix->m_posit).super_dgTemplateVector<float>.m_x;
  fVar13 = (matrix->m_posit).super_dgTemplateVector<float>.m_y;
  fVar14 = (matrix->m_posit).super_dgTemplateVector<float>.m_z;
  fVar15 = (matrix->m_posit).super_dgTemplateVector<float>.m_w;
  (this->super_dgMatrix).m_front.super_dgTemplateVector<float>.m_x =
       (matrix->m_front).super_dgTemplateVector<float>.m_x;
  (this->super_dgMatrix).m_front.super_dgTemplateVector<float>.m_y = fVar1;
  (this->super_dgMatrix).m_front.super_dgTemplateVector<float>.m_z = fVar2;
  (this->super_dgMatrix).m_front.super_dgTemplateVector<float>.m_w = fVar17;
  (this->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_x = fVar19;
  (this->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_y = fVar16;
  (this->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_z = fVar6;
  (this->super_dgMatrix).m_up.super_dgTemplateVector<float>.m_w = fVar7;
  (this->super_dgMatrix).m_right.super_dgTemplateVector<float>.m_x = fVar8;
  (this->super_dgMatrix).m_right.super_dgTemplateVector<float>.m_y = fVar9;
  (this->super_dgMatrix).m_right.super_dgTemplateVector<float>.m_z = fVar10;
  (this->super_dgMatrix).m_right.super_dgTemplateVector<float>.m_w = fVar11;
  (this->super_dgMatrix).m_posit.super_dgTemplateVector<float>.m_x = fVar12;
  (this->super_dgMatrix).m_posit.super_dgTemplateVector<float>.m_y = fVar13;
  (this->super_dgMatrix).m_posit.super_dgTemplateVector<float>.m_z = fVar14;
  (this->super_dgMatrix).m_posit.super_dgTemplateVector<float>.m_w = fVar15;
  fVar1 = (dim->super_dgTemplateVector<float>).m_x;
  fVar2 = (dim->super_dgTemplateVector<float>).m_y;
  fVar17 = (dim->super_dgTemplateVector<float>).m_z;
  auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar2)),ZEXT416((uint)fVar1),ZEXT416((uint)fVar1)
                           );
  auVar18 = vfmadd231ss_fma(auVar18,ZEXT416((uint)fVar17),ZEXT416((uint)fVar17));
  if (auVar18._0_4_ < 0.0) {
    fVar19 = sqrtf(auVar18._0_4_);
  }
  else {
    auVar18 = vsqrtss_avx(auVar18,auVar18);
    fVar19 = auVar18._0_4_;
  }
  if ((!NAN(fVar19)) && ((uint)ABS(fVar19) < 0x7f800000)) {
    auVar18._0_8_ = (ulong)(uint)fVar17 ^ 0x8000000080000000;
    auVar18._8_4_ = 0x80000000;
    auVar18._12_4_ = 0x80000000;
    uVar3 = vcmpss_avx512f(auVar18,ZEXT416((uint)fVar17),2);
    bVar4 = (bool)((byte)uVar3 & 1);
    fVar16 = (float)((uint)bVar4 * (int)fVar17 + (uint)!bVar4 * (int)-fVar17);
    if ((!NAN(fVar16)) && ((uint)ABS(fVar17) < 0x7f800000)) {
      auVar20._0_8_ = (ulong)(uint)fVar2 ^ 0x8000000080000000;
      auVar20._8_4_ = 0x80000000;
      auVar20._12_4_ = 0x80000000;
      uVar3 = vcmpss_avx512f(auVar20,ZEXT416((uint)fVar2),2);
      bVar4 = (bool)((byte)uVar3 & 1);
      fVar17 = (float)((uint)bVar4 * (int)fVar2 + (uint)!bVar4 * (int)-fVar2);
      if (((!NAN(fVar17)) && ((uint)ABS(fVar1) < 0x7f800000)) && ((uint)ABS(fVar2) < 0x7f800000)) {
        auVar5._8_4_ = 0x80000000;
        auVar5._0_8_ = 0x8000000080000000;
        auVar5._12_4_ = 0x80000000;
        auVar18 = vxorps_avx512vl(ZEXT416((uint)fVar1),auVar5);
        uVar3 = vcmpss_avx512f(auVar18,ZEXT416((uint)fVar1),2);
        bVar4 = (bool)((byte)uVar3 & 1);
        (this->m_size).super_dgTemplateVector<float>.m_x =
             (float)((uint)bVar4 * (int)fVar1 + (uint)!bVar4 * auVar18._0_4_);
        (this->m_size).super_dgTemplateVector<float>.m_y = fVar17;
        (this->m_size).super_dgTemplateVector<float>.m_z = fVar16;
        (this->m_size).super_dgTemplateVector<float>.m_w = fVar19;
        return;
      }
    }
  }
  __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                ,0x134,"dgVector::dgVector(hacd::HaF32, hacd::HaF32, hacd::HaF32, hacd::HaF32)");
}

Assistant:

dgSphere::dgSphere(const dgMatrix &matrix, const dgVector& dim)
	:dgMatrix(matrix)
{
   SetDimensions (dim.m_x, dim.m_y, dim.m_z);
//   HACD_ASSERT (0);
//	planeTest = FrontTest;
}